

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode process_trailer(connectdata *conn,zlib_params *zp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CURLcode CVar4;
  
  uVar1 = zp->trailerlen;
  uVar2 = (zp->z).avail_in;
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  zp->trailerlen = uVar1 - uVar3;
  (zp->z).avail_in = uVar2 - uVar3;
  (zp->z).next_in = (zp->z).next_in + uVar3;
  if (uVar2 < uVar1) {
    zp->zlib_init = ZLIB_EXTERNAL_TRAILER;
    return CURLE_OK;
  }
  CVar4 = CURLE_WRITE_ERROR;
  if (uVar2 <= uVar1) {
    CVar4 = CURLE_OK;
  }
  CVar4 = exit_zlib(conn,&zp->z,&zp->zlib_init,CVar4);
  return CVar4;
}

Assistant:

static CURLcode process_trailer(struct connectdata *conn, zlib_params *zp)
{
  z_stream *z = &zp->z;
  CURLcode result = CURLE_OK;
  uInt len = z->avail_in < zp->trailerlen? z->avail_in: zp->trailerlen;

  /* Consume expected trailer bytes. Terminate stream if exhausted.
     Issue an error if unexpected bytes follow. */

  zp->trailerlen -= len;
  z->avail_in -= len;
  z->next_in += len;
  if(z->avail_in)
    result = CURLE_WRITE_ERROR;
  if(result || !zp->trailerlen)
    result = exit_zlib(conn, z, &zp->zlib_init, result);
  else {
    /* Only occurs for gzip with zlib < 1.2.0.4 or raw deflate. */
    zp->zlib_init = ZLIB_EXTERNAL_TRAILER;
  }
  return result;
}